

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-term.c
# Opt level: O1

errr Term_activate(term *t)

{
  errr eVar1;
  
  if (Term == t) {
    eVar1 = 1;
  }
  else {
    if ((Term != (term *)0x0) && (Term->xtra_hook != (_func_errr_wchar_t_wchar_t *)0x0)) {
      (*Term->xtra_hook)(L'\f',L'\0');
    }
    if (t == (term *)0x0) {
      eVar1 = 0;
      Term = t;
    }
    else {
      if (t->active_flag == false) {
        if (t->init_hook != (_func_void_term_ptr *)0x0) {
          (*t->init_hook)(t);
        }
        t->active_flag = true;
        t->mapped_flag = true;
      }
      eVar1 = 0;
      Term = t;
      if (t->xtra_hook != (_func_errr_wchar_t_wchar_t *)0x0) {
        (*t->xtra_hook)(L'\f',L'\x01');
        eVar1 = 0;
      }
    }
  }
  return eVar1;
}

Assistant:

errr Term_activate(term *t)
{
	/* Hack -- already done */
	if (Term == t) return (1);

	/* Deactivate the old Term */
	if (Term) Term_xtra(TERM_XTRA_LEVEL, 0);

	/* Hack -- Call the special "init" hook */
	if (t && !t->active_flag) {
		/* Call the "init" hook */
		if (t->init_hook) (*t->init_hook)(t);

		/* Remember */
		t->active_flag = true;

		/* Assume mapped */
		t->mapped_flag = true;
	}

	/* Remember the Term */
	Term = t;

	/* Activate the new Term */
	if (Term) Term_xtra(TERM_XTRA_LEVEL, 1);

	/* Success */
	return (0);
}